

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lbaselib.c
# Opt level: O1

int luaB_print(lua_State *L)

{
  int iVar1;
  int iVar2;
  size_t in_RAX;
  char *s;
  uint idx;
  int unaff_EBP;
  size_t l;
  size_t local_38;
  
  local_38 = in_RAX;
  iVar2 = lua_gettop(L);
  lua_getglobal(L,"tostring");
  if (0 < iVar2) {
    idx = 1;
    do {
      lua_pushvalue(L,-1);
      lua_pushvalue(L,idx);
      lua_callk(L,1,1,0,(lua_KFunction)0x0);
      s = lua_tolstring(L,-1,&local_38);
      if (s == (char *)0x0) {
        unaff_EBP = luaL_error(L,"\'tostring\' must return a string to \'print\'");
      }
      else {
        if (1 < idx) {
          ravi_writestring(L,"\t",1);
        }
        ravi_writestring(L,s,local_38);
        lua_settop(L,-2);
      }
      if (s == (char *)0x0) {
        return unaff_EBP;
      }
      iVar1 = (1 - iVar2) + idx;
      idx = idx + 1;
    } while (iVar1 != 1);
  }
  ravi_writeline(L);
  return 0;
}

Assistant:

static int luaB_print (lua_State *L) {
  int n = lua_gettop(L);  /* number of arguments */
  int i;
  lua_getglobal(L, "tostring");
  for (i=1; i<=n; i++) {
    const char *s;
    size_t l;
    lua_pushvalue(L, -1);  /* function to be called */
    lua_pushvalue(L, i);   /* value to print */
    lua_call(L, 1, 1);
    s = lua_tolstring(L, -1, &l);  /* get result */
    if (s == NULL)
      return luaL_error(L, "'tostring' must return a string to 'print'");
    if (i>1) lua_writestring("\t", 1);
    lua_writestring(s, l);
    lua_pop(L, 1);  /* pop result */
  }
  lua_writeline();
  return 0;
}